

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O1

ActionResults * __thiscall AbstractRoomAction::Throw(AbstractRoomAction *this)

{
  ItemTable *pIVar1;
  itemType iVar2;
  itemLocation iVar3;
  ItemWrapper *pIVar4;
  long *plVar5;
  ItemWrapper *this_00;
  ActionResults *this_01;
  long *plVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string information;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 local_e0 [20];
  itemType local_cc;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  string local_68;
  string local_48;
  
  local_e8 = (char *)0x0;
  local_e0[0] = 0;
  pIVar1 = this->itemList;
  local_f0 = local_e0;
  iVar2 = Command::getMainItem(this->commands);
  local_a8 = (long *)CONCAT44(local_a8._4_4_,iVar2);
  pIVar4 = ItemTable::getValue(pIVar1,(itemType *)&local_a8);
  iVar3 = ItemWrapper::getLocation(pIVar4);
  if (iVar3 == BACKPACK) {
    pIVar1 = this->itemList;
    local_cc = Command::getMainItem(this->commands);
    pIVar4 = ItemTable::getValue(pIVar1,&local_cc);
    ItemWrapper::getItemName_abi_cxx11_(&local_48,pIVar4);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1275dc);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_b8 = *plVar6;
      lStack_b0 = plVar5[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar6;
      local_c8 = (long *)*plVar5;
    }
    local_c0 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_98 = *plVar6;
      lStack_90 = plVar5[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar6;
      local_a8 = (long *)*plVar5;
    }
    local_a0 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_a8);
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    pIVar1 = this->itemList;
    iVar2 = Command::getMainItem(this->commands);
    local_a8 = (long *)CONCAT44(local_a8._4_4_,iVar2);
    pIVar4 = ItemTable::getValue(pIVar1,(itemType *)&local_a8);
    local_c8 = (long *)((ulong)local_c8 & 0xffffffff00000000);
    this_00 = ItemTable::getValue(this->itemList,(itemType *)&local_c8);
    iVar3 = ItemWrapper::getLocation(this_00);
    ItemWrapper::setLocation(pIVar4,iVar3);
    this_01 = (ActionResults *)operator_new(0x30);
    paVar8 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_f0,local_e8 + (long)local_f0);
    ActionResults::ActionResults(this_01,CURRENT,&local_88);
    _Var7._M_p = local_88._M_dataplus._M_p;
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,0x12756e);
    this_01 = (ActionResults *)operator_new(0x30);
    paVar8 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_f0,local_e8 + (long)local_f0);
    ActionResults::ActionResults(this_01,CURRENT,&local_68);
    _Var7._M_p = local_68._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return this_01;
}

Assistant:

ActionResults * AbstractRoomAction::Throw() {

    std::string information;

    if (itemList->getValue(commands->getMainItem())->getLocation() != BACKPACK) {
        information = "You can not throw an item that you do not currently "
                "have in your backpack. Pick up item in order to throw it.";
        return new ActionResults(CURRENT, information);
    }

    information = "You throw the  " + itemList->getValue(commands->getMainItem())->getItemName() + " to the ground";
    itemList->getValue(commands->getMainItem())->setLocation(itemList->getValue(PLAYER)->getLocation());

    return new ActionResults(CURRENT, information);
}